

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parseInputMessageContent_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  TgTypeParser *pTVar1;
  element_type *peVar2;
  size_t sVar3;
  pointer pcVar4;
  int iVar5;
  undefined8 uVar6;
  size_type sVar7;
  char *pcVar8;
  bool bVar9;
  Ptr local_60;
  undefined1 local_50 [32];
  
  peVar2 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  peVar2 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pTVar1 = (TgTypeParser *)(local_50 + 0x10);
  pcVar8 = "InputTextMessageContent";
  local_50._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"InputTextMessageContent","");
  sVar3 = (peVar2->type)._M_string_length;
  if (sVar3 == local_50._8_8_) {
    if (sVar3 == 0) {
      bVar9 = true;
    }
    else {
      pcVar8 = (char *)local_50._0_8_;
      iVar5 = bcmp((peVar2->type)._M_dataplus._M_p,(void *)local_50._0_8_,sVar3);
      bVar9 = iVar5 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (bVar9) {
    local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.
              super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.
              super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    parseInputTextMessageContent_abi_cxx11_
              ((string *)local_50,(TgTypeParser *)pcVar8,(Ptr *)&local_60);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
  }
  else {
    peVar2 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pcVar8 = "InputLocationMessageContent";
    local_50._0_8_ = pTVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"InputLocationMessageContent","");
    sVar3 = (peVar2->type)._M_string_length;
    if (sVar3 == local_50._8_8_) {
      if (sVar3 == 0) {
        bVar9 = true;
      }
      else {
        pcVar8 = (char *)local_50._0_8_;
        iVar5 = bcmp((peVar2->type)._M_dataplus._M_p,(void *)local_50._0_8_,sVar3);
        bVar9 = iVar5 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
      operator_delete((void *)local_50._0_8_);
    }
    if (bVar9) {
      local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.
           super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.
                super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.
           super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.
                super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      parseInputLocationMessageContent_abi_cxx11_
                ((string *)local_50,(TgTypeParser *)pcVar8,(Ptr *)&local_60);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
    }
    else {
      peVar2 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pcVar8 = "InputVenueMessageContent";
      local_50._0_8_ = pTVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"InputVenueMessageContent","");
      sVar3 = (peVar2->type)._M_string_length;
      if (sVar3 == local_50._8_8_) {
        if (sVar3 == 0) {
          bVar9 = true;
        }
        else {
          pcVar8 = (char *)local_50._0_8_;
          iVar5 = bcmp((peVar2->type)._M_dataplus._M_p,(void *)local_50._0_8_,sVar3);
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
        operator_delete((void *)local_50._0_8_);
      }
      if (bVar9) {
        local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_60.
            super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.
             super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.
             super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        parseInputVenueMessageContent_abi_cxx11_
                  ((string *)local_50,(TgTypeParser *)pcVar8,(Ptr *)&local_60);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
      }
      else {
        peVar2 = (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        pcVar8 = "InputContactMessageContent";
        local_50._0_8_ = pTVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"InputContactMessageContent","");
        sVar3 = (peVar2->type)._M_string_length;
        if (sVar3 == local_50._8_8_) {
          if (sVar3 == 0) {
            bVar9 = true;
          }
          else {
            pcVar8 = (char *)local_50._0_8_;
            iVar5 = bcmp((peVar2->type)._M_dataplus._M_p,(void *)local_50._0_8_,sVar3);
            bVar9 = iVar5 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
          operator_delete((void *)local_50._0_8_);
        }
        if (!bVar9) goto LAB_001c91a8;
        local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (object->super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_60.
            super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.
             super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.
             super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        parseInputContactMessageContent_abi_cxx11_
                  ((string *)local_50,(TgTypeParser *)pcVar8,&local_60);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
      }
    }
  }
  if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
LAB_001c91a8:
  sVar7 = __return_storage_ptr__->_M_string_length - 1;
  if (__return_storage_ptr__->_M_string_length != 0) {
    __return_storage_ptr__->_M_string_length = sVar7;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar7] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
  ;
  if ((TgTypeParser *)local_50._0_8_ != pTVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (local_60.super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<TgBot::InputContactMessageContent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &__return_storage_ptr__->field_2) {
    operator_delete(pcVar4);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

std::string TgTypeParser::parseInputMessageContent(const InputMessageContent::Ptr& object) const {
    if (!object){
        return "";
    }

    string result;
    result += '{';

    if (object->type == std::string("InputTextMessageContent")) {
        result += parseInputTextMessageContent(static_pointer_cast<InputTextMessageContent>(object));
    }
    else if (object->type == std::string("InputLocationMessageContent")) {
        result += parseInputLocationMessageContent(static_pointer_cast<InputLocationMessageContent>(object));
    }
    else if (object->type == std::string("InputVenueMessageContent")) {
        result += parseInputVenueMessageContent(static_pointer_cast<InputVenueMessageContent>(object));
    }
    else if (object->type == std::string("InputContactMessageContent")) {
        result += parseInputContactMessageContent(static_pointer_cast<InputContactMessageContent>(object));
    }

    removeLastComma(result);
    result += '}';
    return result;
}